

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WriteProjectHeader(cmLocalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  cmMakefile *this_00;
  char *pcVar2;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar1 = std::operator<<(os,"# Project: ");
  this_00 = cmLocalGenerator::GetMakefile(&this->super_cmLocalGenerator);
  pcVar2 = cmMakefile::GetProjectName(this_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# Configuration: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->ConfigName);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  cmGlobalNinjaGenerator::WriteDivider(os);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProjectHeader(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os
    << "# Project: " << this->GetMakefile()->GetProjectName() << std::endl
    << "# Configuration: " << this->ConfigName << std::endl
    ;
  cmGlobalNinjaGenerator::WriteDivider(os);
}